

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

string * __thiscall
Logger::format_timestamp_abi_cxx11_(string *__return_storage_ptr__,Logger *this,unsigned_long ts)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ostream *poVar3;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a8,SUB164(auVar1 / ZEXT816(0xe10),0));
  poVar3 = (ostream *)std::operator<<(poVar2," hours ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar3,(int)(((ulong)this / 0x3c) % 0x3c));
  poVar3 = (ostream *)std::operator<<(poVar2," minutes ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar3,(int)((ulong)this % 0x3c));
  std::operator<<(poVar2," seconds");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Logger::format_timestamp(unsigned long ts) {
  auto minutes = ts/60;
  auto hours = minutes/60;
  std::stringstream ss;
  ss << int(hours) << " hours "
     << int(minutes%60) << " minutes "
     << int(ts%60) << " seconds";
  return ss.str();
}